

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

void prelu(pBox *pbox,mydataFmt *pbias,mydataFmt *prelu_gmma)

{
  int iVar1;
  float *pfVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  
  pfVar2 = pbox->pdata;
  if (pfVar2 == (float *)0x0) {
    pcVar4 = "the  pRelu feature is NULL!!";
    lVar3 = 0x1c;
  }
  else {
    if (pbias != (mydataFmt *)0x0) {
      iVar1 = pbox->channel;
      if (0 < iVar1) {
        iVar6 = pbox->height * pbox->width;
        iVar5 = 0;
        do {
          iVar7 = iVar6;
          if (0 < iVar6) {
            do {
              fVar8 = *pfVar2 + *pbias;
              *pfVar2 = fVar8;
              if (fVar8 <= 0.0) {
                fVar8 = fVar8 * *prelu_gmma;
              }
              *pfVar2 = fVar8;
              pfVar2 = pfVar2 + 1;
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
          pbias = pbias + 1;
          prelu_gmma = prelu_gmma + 1;
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar1);
      }
      return;
    }
    pcVar4 = "the  pRelu bias is NULL!!";
    lVar3 = 0x19;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return;
}

Assistant:

void prelu(struct pBox *pbox, mydataFmt *pbias, mydataFmt *prelu_gmma) {
    if (pbox->pdata == NULL) {
        cout << "the  pRelu feature is NULL!!" << endl;
        return;
    }
    if (pbias == NULL) {
        cout << "the  pRelu bias is NULL!!" << endl;
        return;
    }
    mydataFmt *op = pbox->pdata;
    mydataFmt *pb = pbias;
    mydataFmt *pg = prelu_gmma;

    long dis = pbox->width * pbox->height;
    for (int channel = 0; channel < pbox->channel; channel++) {
        for (int col = 0; col < dis; col++) {
            *op = *op + *pb;
            *op = (*op > 0) ? (*op) : ((*op) * (*pg));
            op++;
        }
        pb++;
        pg++;
    }
}